

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_stbvorbis_get_cursor_in_pcm_frames(ma_stbvorbis *pVorbis,ma_uint64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_uint64 *)0x0) && (*pCursor = 0, pVorbis != (ma_stbvorbis *)0x0)) {
    *pCursor = pVorbis->cursor;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_stbvorbis_get_cursor_in_pcm_frames(ma_stbvorbis* pVorbis, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;   /* Safety. */

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        *pCursor = pVorbis->cursor;

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}